

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lehrfem_info.cc
# Opt level: O0

void lf::base::LehrFemInfo::PrintInfo(ostream *stream)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string version_datetime;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string version;
  ostream *stream_local;
  
  version.field_2._8_8_ = stream;
  std::__cxx11::string::string((string *)local_30);
  getVersionTag_abi_cxx11_();
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    getVersionSha_abi_cxx11_();
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "unknown");
    }
    else {
      getVersionSha_abi_cxx11_();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&version_datetime.field_2 + 8));
      std::__cxx11::string::~string((string *)(version_datetime.field_2._M_local_buf + 8));
    }
  }
  else {
    getVersionTag_abi_cxx11_();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
               &local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,sVar2,
             0x38 - sVar3,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,"|\n");
  std::__cxx11::string::string((string *)local_e0);
  getVersionDateTime_abi_cxx11_();
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    getVersionDateTime_abi_cxx11_();
    std::operator+(&local_140,"(",&local_160);
    std::operator+(&local_120,&local_140,")");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
               &local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,sVar2,
             0x38 - sVar3,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,"|\n");
  std::operator<<((ostream *)version.field_2._8_8_,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "+------------------------------------------------------------------+");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|        __         __         ______________  ___                 |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|       / /   ___  / /_  _____/ ____/ ____/  |/  / __    __        |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|      / /   / _ \\/ __ \\/ ___/ /_  / __/ / /|_/ /_/ /___/ /_       |")
  ;
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|     / /___/  __/ / / / /  / __/ / /___/ /  / /_  __/_  __/       |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|    /_____/\\___/_/ /_/_/  /_/   /_____/_/  /_/ /_/   /_/          |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|                                                                  |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|                                                                  |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "| Maintained by Raffael Casagrande and Ralf Hiptmair with          |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "| contributions from many other people.                            |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|                                                                  |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,"| Version: ");
  std::operator<<(poVar4,(string *)local_30);
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,"|          ");
  std::operator<<(poVar4,(string *)local_e0);
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "|  Source: https://github.com/craffael/lehrfempp                   |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "| License: MIT License                                             |");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)version.field_2._8_8_,
                           "+------------------------------------------------------------------+");
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)version.field_2._8_8_,"\n");
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void LehrFemInfo::PrintInfo(std::ostream &stream) {
  std::string version;
  if (!getVersionTag().empty()) {
    version = getVersionTag();
  } else if (!getVersionSha().empty()) {
    version = getVersionSha();
  } else {
    version = "unknown";
  }
  version.insert(version.size(), 56 - version.size(), ' ');
  version += "|\n";

  std::string version_datetime;
  if (!getVersionDateTime().empty()) {
    version_datetime = "(" + getVersionDateTime() + ")";
  }

  version_datetime.insert(version_datetime.size(), 56 - version_datetime.size(),
                          ' ');
  version_datetime += "|\n";

  // clang-format off
  stream << "\n";
  stream << R"foo(+------------------------------------------------------------------+)foo" << "\n";
  stream << R"foo(|        __         __         ______________  ___                 |)foo" << "\n";
  stream << R"foo(|       / /   ___  / /_  _____/ ____/ ____/  |/  / __    __        |)foo" << "\n";
  stream << R"foo(|      / /   / _ \/ __ \/ ___/ /_  / __/ / /|_/ /_/ /___/ /_       |)foo" << "\n";
  stream << R"foo(|     / /___/  __/ / / / /  / __/ / /___/ /  / /_  __/_  __/       |)foo" << "\n";
  stream << R"foo(|    /_____/\___/_/ /_/_/  /_/   /_____/_/  /_/ /_/   /_/          |)foo" << "\n";
  stream << R"foo(|                                                                  |)foo" << "\n";
  stream << R"foo(|                                                                  |)foo" << "\n";
  stream << R"foo(| Maintained by Raffael Casagrande and Ralf Hiptmair with          |)foo" << "\n";
  stream << R"foo(| contributions from many other people.                            |)foo" << "\n";
  stream << R"foo(|                                                                  |)foo" << "\n";
  stream << R"foo(| Version: )foo" << version;           
  stream << R"foo(|          )foo" << version_datetime;
  stream << R"foo(|  Source: https://github.com/craffael/lehrfempp                   |)foo" << "\n";
  stream << R"foo(| License: MIT License                                             |)foo" << "\n";
  stream << R"foo(+------------------------------------------------------------------+)foo" << "\n";
  stream << "\n";
  // clang-format on
}